

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

Var Js::InterpreterStackFrame::InterpreterThunk(JavascriptCallStackLayout *layout)

{
  Type function_00;
  Var pvVar1;
  void *unaff_retaddr;
  ArgumentReader local_48;
  void *localAddressOfReturnAddress;
  void *localReturnAddress;
  ArgumentReader args;
  ScriptFunction *function;
  JavascriptCallStackLayout *layout_local;
  
  args.super_Arguments.Values =
       (Type)UnsafeVarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)layout);
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&localReturnAddress,(CallInfo *)(layout + 8),(Var *)(layout + 0x10));
  function_00 = args.super_Arguments.Values;
  ArgumentReader::ArgumentReader(&local_48,(ArgumentReader *)&localReturnAddress);
  pvVar1 = InterpreterHelper((ScriptFunction *)function_00,&local_48,unaff_retaddr,&stack0x00000000,
                             (AsmJsReturnStruct *)0x0);
  return pvVar1;
}

Assistant:

Var InterpreterStackFrame::InterpreterThunk(JavascriptCallStackLayout* layout)
    {
        Js::ScriptFunction * function = Js::UnsafeVarTo<Js::ScriptFunction>(layout->functionObject);
        Js::ArgumentReader args(&layout->callInfo, layout->args);
        void* localReturnAddress = _ReturnAddress();
        void* localAddressOfReturnAddress = _AddressOfReturnAddress();
        return InterpreterHelper(function, args, localReturnAddress, localAddressOfReturnAddress);
    }